

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxIn::ConfidentialTxIn
          (ConfidentialTxIn *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script,ScriptWitness *witness_stack,ByteData256 *blinding_nonce,
          ByteData256 *asset_entropy,ConfidentialValue *issuance_amount,
          ConfidentialValue *inflation_keys,ByteData *issuance_amount_rangeproof,
          ByteData *inflation_keys_rangeproof,ScriptWitness *pegin_witness)

{
  AbstractTxIn::AbstractTxIn(&this->super_AbstractTxIn,txid,index,sequence,unlocking_script);
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__ConfidentialTxIn_0068de68;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->blinding_nonce_).data_,&blinding_nonce->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->asset_entropy_).data_,&asset_entropy->data_);
  ConfidentialValue::ConfidentialValue(&this->issuance_amount_,issuance_amount);
  ConfidentialValue::ConfidentialValue(&this->inflation_keys_,inflation_keys);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->issuance_amount_rangeproof_).data_,&issuance_amount_rangeproof->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->inflation_keys_rangeproof_).data_,&inflation_keys_rangeproof->data_);
  (this->pegin_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->pegin_witness_).witness_stack_,&pegin_witness->witness_stack_);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&(this->super_AbstractTxIn).script_witness_.witness_stack_,
             &witness_stack->witness_stack_);
  return;
}

Assistant:

ConfidentialTxIn::ConfidentialTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script, const ScriptWitness &witness_stack,
    const ByteData256 &blinding_nonce, const ByteData256 &asset_entropy,
    const ConfidentialValue &issuance_amount,
    const ConfidentialValue &inflation_keys,
    const ByteData &issuance_amount_rangeproof,
    const ByteData &inflation_keys_rangeproof,
    const ScriptWitness &pegin_witness)
    : AbstractTxIn(txid, index, sequence, unlocking_script),
      blinding_nonce_(blinding_nonce),
      asset_entropy_(asset_entropy),
      issuance_amount_(issuance_amount),
      inflation_keys_(inflation_keys),
      issuance_amount_rangeproof_(issuance_amount_rangeproof),
      inflation_keys_rangeproof_(inflation_keys_rangeproof),
      pegin_witness_(pegin_witness) {
  script_witness_ = witness_stack;
}